

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

void Saig_ManRetimeDup_rec(Aig_Man_t *pNew,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pNew_local;
  
  if ((pObj->field_5).pData == (void *)0x0) {
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigRetMin.c"
                    ,0x108,"void Saig_ManRetimeDup_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
    pAVar2 = Aig_ObjFanin0(pObj);
    Saig_ManRetimeDup_rec(pNew,pAVar2);
    pAVar2 = Aig_ObjFanin1(pObj);
    Saig_ManRetimeDup_rec(pNew,pAVar2);
    pAVar2 = Aig_ObjChild0Copy(pObj);
    p1 = Aig_ObjChild1Copy(pObj);
    pAVar2 = Aig_And(pNew,pAVar2,p1);
    (pObj->field_5).pData = pAVar2;
  }
  return;
}

Assistant:

void Saig_ManRetimeDup_rec( Aig_Man_t * pNew, Aig_Obj_t * pObj )
{
    if ( pObj->pData )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
    Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin1(pObj) );
    pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
}